

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

bool LTFlightData::CheckDupKey(FDKeyTy *_key,FDKeyType _ty)

{
  pointer pcVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  FDKeyTy cpyKey;
  
  FDKeyTy::FDKeyTy(&cpyKey,_ty,_key->num);
  sVar2 = std::
          map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
          ::count(&mapFd,&cpyKey);
  if (sVar2 != 0) {
    if ((int)dataRefs.iLogLevel < 1) {
      pcVar1 = (_key->key)._M_dataplus._M_p;
      pcVar3 = FDKeyTy::GetKeyTypeText(_key);
      pcVar4 = FDKeyTy::GetKeyTypeText(&cpyKey);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
             ,0x1a6,"CheckDupKey",logDEBUG,
             "Handling same key %s of different types: %s replaced by %s",pcVar1,pcVar3,pcVar4);
    }
    FDKeyTy::operator=(_key,&cpyKey);
  }
  std::__cxx11::string::~string((string *)&cpyKey.key);
  return sVar2 != 0;
}

Assistant:

bool LTFlightData::CheckDupKey(LTFlightData::FDKeyTy& _key, LTFlightData::FDKeyType _ty)
{
    LTFlightData::FDKeyTy cpyKey(_ty, _key.num);
    if (mapFd.count(cpyKey) > 0) {
        LOG_MSG(logDEBUG, "Handling same key %s of different types: %s replaced by %s",
                _key.c_str(), _key.GetKeyTypeText(), cpyKey.GetKeyTypeText());
        _key = std::move(cpyKey);
        return true;
    }
    return false;
}